

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_path.c
# Opt level: O2

CURLcode Curl_getworkingpath(connectdata *conn,char *homedir,char **path)

{
  uint uVar1;
  size_t sVar2;
  CURLcode CVar3;
  int iVar4;
  size_t sVar5;
  char *__dest;
  char *__dest_00;
  char *__src;
  char *working_path;
  size_t working_path_len;
  
  CVar3 = Curl_urldecode(conn->data,(conn->data->state).path,0,&working_path,&working_path_len,false
                        );
  sVar2 = working_path_len;
  if (CVar3 != CURLE_OK) {
    return CVar3;
  }
  uVar1 = conn->handler->protocol;
  if ((uVar1 & 0x10) == 0) {
    if ((uVar1 & 0x20) == 0) {
      __dest = (char *)0x0;
      goto LAB_0013f05a;
    }
    if ((working_path_len < 2) || (working_path[1] != '~')) {
      __dest_00 = (char *)(*Curl_cmalloc)(working_path_len + 1);
      if (__dest_00 == (char *)0x0) goto LAB_0013f06f;
      sVar5 = working_path_len + 1;
      __src = working_path;
      __dest = __dest_00;
    }
    else {
      sVar5 = strlen(homedir);
      __dest = (char *)(*Curl_cmalloc)(sVar2 + sVar5 + 1);
      if (__dest == (char *)0x0) {
LAB_0013f06f:
        (*Curl_cfree)(working_path);
        return CURLE_OUT_OF_MEMORY;
      }
      memcpy(__dest,homedir,sVar5);
      (__dest + sVar5)[0] = '/';
      (__dest + sVar5)[1] = '\0';
      if (working_path_len < 4) goto LAB_0013f05a;
      __dest_00 = __dest + sVar5 + 1;
      sVar5 = working_path_len - 2;
      __src = working_path + 3;
    }
  }
  else {
    __dest_00 = (char *)(*Curl_cmalloc)(working_path_len + 1);
    __src = working_path;
    if (__dest_00 == (char *)0x0) goto LAB_0013f06f;
    if ((3 < working_path_len) && (iVar4 = bcmp(working_path,"/~/",3), iVar4 == 0)) {
      __src = __src + 3;
    }
    sVar5 = working_path_len + 1;
    __dest = __dest_00;
  }
  memcpy(__dest_00,__src,sVar5);
LAB_0013f05a:
  (*Curl_cfree)(working_path);
  *path = __dest;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_getworkingpath(struct connectdata *conn,
                             char *homedir,  /* when SFTP is used */
                             char **path) /* returns the  allocated
                                             real path to work with */
{
  struct Curl_easy *data = conn->data;
  char *real_path = NULL;
  char *working_path;
  size_t working_path_len;
  CURLcode result =
    Curl_urldecode(data, data->state.path, 0, &working_path,
                   &working_path_len, FALSE);
  if(result)
    return result;

  /* Check for /~/, indicating relative to the user's home directory */
  if(conn->handler->protocol & CURLPROTO_SCP) {
    real_path = malloc(working_path_len + 1);
    if(real_path == NULL) {
      free(working_path);
      return CURLE_OUT_OF_MEMORY;
    }
    if((working_path_len > 3) && (!memcmp(working_path, "/~/", 3)))
      /* It is referenced to the home directory, so strip the leading '/~/' */
      memcpy(real_path, working_path + 3, 4 + working_path_len-3);
    else
      memcpy(real_path, working_path, 1 + working_path_len);
  }
  else if(conn->handler->protocol & CURLPROTO_SFTP) {
    if((working_path_len > 1) && (working_path[1] == '~')) {
      size_t homelen = strlen(homedir);
      real_path = malloc(homelen + working_path_len + 1);
      if(real_path == NULL) {
        free(working_path);
        return CURLE_OUT_OF_MEMORY;
      }
      /* It is referenced to the home directory, so strip the
         leading '/' */
      memcpy(real_path, homedir, homelen);
      real_path[homelen] = '/';
      real_path[homelen + 1] = '\0';
      if(working_path_len > 3) {
        memcpy(real_path + homelen + 1, working_path + 3,
               1 + working_path_len -3);
      }
    }
    else {
      real_path = malloc(working_path_len + 1);
      if(real_path == NULL) {
        free(working_path);
        return CURLE_OUT_OF_MEMORY;
      }
      memcpy(real_path, working_path, 1 + working_path_len);
    }
  }

  free(working_path);

  /* store the pointer for the caller to receive */
  *path = real_path;

  return CURLE_OK;
}